

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O3

Expression * __thiscall
anon_unknown.dwarf_c94a2::AssertionEmitter::translateInvoke
          (AssertionEmitter *this,InvokeAction *invoke,Module *wasm)

{
  InvokeAction *pIVar1;
  Call *pCVar2;
  undefined8 *puVar3;
  Type type;
  long lVar4;
  Literal *pLVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  Name NVar9;
  Name NVar10;
  Literal local_80;
  Expression *local_68;
  InvokeAction *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Builder builder;
  
  auStack_58 = (undefined1  [8])0x0;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = (*(long *)&(this->options).super_Options.extra._M_t._M_impl.super__Rb_tree_header.
                     _M_header - *(long *)&(this->options).super_Options.extra._M_t._M_impl >> 3) *
          -0x5555555555555555 + (this->flags).symbolsFile.field_2._M_allocated_capacity;
  local_60 = invoke;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)invoke;
  if (lVar7 != 0) {
    lVar8 = -0x18;
    lVar4 = 0;
    do {
      pLVar5 = (Literal *)(*(long *)&(this->options).super_Options.extra._M_t._M_impl + lVar8);
      if (lVar4 == 0) {
        pLVar5 = (Literal *)((long)&(this->flags).symbolsFile.field_2 + 8);
      }
      ::wasm::Literal::Literal(&local_80,pLVar5);
      local_68 = ::wasm::Builder::makeConstantExpression
                           ((Builder *)
                            &args.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_80);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,&local_68
                );
      ::wasm::Literal::~Literal(&local_80);
      lVar4 = lVar4 + 1;
      lVar8 = lVar8 + 0x18;
    } while (lVar7 != lVar4);
  }
  pIVar1 = local_60;
  NVar9.super_IString.str._M_str = (this->flags).symbolsFile._M_dataplus._M_p;
  NVar9.super_IString.str._M_len = (size_t)local_60;
  lVar7 = ::wasm::Module::getExport(NVar9);
  pcVar6 = (char *)0x0;
  if (*(int *)(lVar7 + 0x10) == 0) {
    puVar3 = (undefined8 *)0x0;
    if (*(char *)(lVar7 + 0x28) == '\0') {
      puVar3 = (undefined8 *)(lVar7 + 0x18);
    }
    pcVar6 = (char *)*puVar3;
  }
  NVar10.super_IString.str._M_str = pcVar6;
  NVar10.super_IString.str._M_len = (size_t)pIVar1;
  ::wasm::Module::getFunction(NVar10);
  ::wasm::HeapType::getSignature();
  pCVar2 = ::wasm::Builder::makeCall
                     ((Builder *)
                      &args.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (IString)*(IString *)&(this->flags).symbolsFile,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58,
                      type,false);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return (Expression *)pCVar2;
}

Assistant:

Expression* AssertionEmitter::translateInvoke(InvokeAction& invoke,
                                              Module& wasm) {
  std::vector<Expression*> args;
  Builder builder(wasm);
  for (auto& arg : invoke.args) {
    args.push_back(builder.makeConstantExpression(arg));
  }
  Export* exp = wasm.getExport(invoke.name);
  Type type = wasm
                .getFunction((exp->kind == ExternalKind::Function)
                               ? *exp->getInternalName()
                               : Name())
                ->getResults();
  return builder.makeCall(invoke.name, args, type);
}